

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MEdge>
          (Structure *this,MEdge *dest,FileDatabase *db)

{
  element_type *this_00;
  FileDatabase *db_local;
  MEdge *dest_local;
  Structure *this_local;
  
  ReadField<2,int>(this,&dest->v1,"v1",db);
  ReadField<2,int>(this,&dest->v2,"v2",db);
  ReadField<1,char>(this,&dest->crease,"crease",db);
  ReadField<1,char>(this,&dest->bweight,"bweight",db);
  ReadField<1,short>(this,&dest->flag,"flag",db);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&db->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<MEdge> (
    MEdge& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.v1,"v1",db);
    ReadField<ErrorPolicy_Fail>(dest.v2,"v2",db);
    ReadField<ErrorPolicy_Igno>(dest.crease,"crease",db);
    ReadField<ErrorPolicy_Igno>(dest.bweight,"bweight",db);
    ReadField<ErrorPolicy_Igno>(dest.flag,"flag",db);

    db.reader->IncPtr(size);
}